

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O2

bool TCV::isMatchType(string *lhs,string *rhs)

{
  bool bVar1;
  __type _Var2;
  
  bVar1 = std::operator==(rhs,"integer");
  if ((bVar1) && (bVar1 = std::operator==(lhs,"intnum"), bVar1)) {
    return true;
  }
  bVar1 = std::operator==(rhs,"intnum");
  if ((bVar1) && (bVar1 = std::operator==(lhs,"integer"), bVar1)) {
    return true;
  }
  bVar1 = std::operator==(rhs,"float");
  if ((bVar1) && (bVar1 = std::operator==(lhs,"floatnum"), bVar1)) {
    return true;
  }
  bVar1 = std::operator==(rhs,"floatnum");
  if ((bVar1) && (bVar1 = std::operator==(lhs,"float"), bVar1)) {
    return true;
  }
  _Var2 = std::operator==(rhs,lhs);
  return _Var2;
}

Assistant:

bool TCV::isMatchType(const std::string &lhs, const std::string &rhs) {
    if ((rhs == "integer" && lhs == "intnum") || (rhs == "intnum" && lhs == "integer")) return true;
    else if ((rhs == "float" && lhs == "floatnum") || (rhs == "floatnum" && lhs == "float")) return true;
    else return rhs == lhs;
}